

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

void __thiscall
glcts::SampleShadingRenderCase::SampleShadingRenderCase
          (SampleShadingRenderCase *this,Context *context,char *name,char *description,
          GLSLVersion glslVersion,GLenum internalFormat,TextureFormat *texFormat,char *sampler,
          char *outType,GLfloat min,GLfloat max,char *extension,GLfloat sampleShading)

{
  allocator<char> local_4e;
  allocator<char> local_4d [16];
  allocator<char> local_3d;
  GLfloat local_3c;
  GLfloat local_38;
  GLfloat sampleShading_local;
  GLfloat max_local;
  GLfloat min_local;
  GLenum internalFormat_local;
  GLSLVersion glslVersion_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  SampleShadingRenderCase *this_local;
  
  local_3c = sampleShading;
  local_38 = max;
  sampleShading_local = min;
  max_local = (GLfloat)internalFormat;
  min_local = (GLfloat)glslVersion;
  _internalFormat_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  deqp::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SampleShadingRenderCase_0325c408;
  this->m_glslVersion = (GLSLVersion)min_local;
  this->m_internalFormat = (GLenum)max_local;
  this->m_texFormat = *texFormat;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_sampler,sampler,&local_3d);
  std::allocator<char>::~allocator(&local_3d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_outType,outType,local_4d);
  std::allocator<char>::~allocator(local_4d);
  this->m_min = sampleShading_local;
  this->m_max = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_extension,extension,&local_4e);
  std::allocator<char>::~allocator(&local_4e);
  this->m_sampleShading = local_3c;
  return;
}

Assistant:

SampleShadingRenderCase::SampleShadingRenderCase(Context& context, const char* name, const char* description,
												 glu::GLSLVersion glslVersion, GLenum internalFormat,
												 tcu::TextureFormat const& texFormat, const char* sampler,
												 const char* outType, GLfloat min, GLfloat max, const char* extension,
												 GLfloat sampleShading)
	: TestCase(context, name, description)
	, m_glslVersion(glslVersion)
	, m_internalFormat(internalFormat)
	, m_texFormat(texFormat)
	, m_sampler(sampler)
	, m_outType(outType)
	, m_min(min)
	, m_max(max)
	, m_extension(extension)
	, m_sampleShading(sampleShading)
{
	DE_ASSERT(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion >= glu::GLSL_VERSION_400);
}